

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O1

void __thiscall
boost::runtime::basic_param::cla_name_help
          (basic_param *this,ostream *ostr,cstring *cla_tag,cstring *param_3)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,cla_tag->m_begin,cla_tag->m_end);
  std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

virtual void            cla_name_help( std::ostream& ostr, cstring cla_tag, cstring /* negation_prefix_ */) const
    {
        ostr << cla_tag;
    }